

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarsWithScalars
          (InterfaceVariableScalarReplacement *this,Instruction *entry_point)

{
  bool bVar1;
  Op OVar2;
  reference ppIVar3;
  IRContext *pIVar4;
  DefUseManager *pDVar5;
  uint32_t local_74;
  Instruction *pIStack_70;
  uint32_t extra_array_length;
  Instruction *interface_var_type;
  uint32_t component;
  uint32_t location;
  Instruction *interface_var;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  undefined1 local_38 [4];
  Status status;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> interface_vars
  ;
  Instruction *entry_point_local;
  InterfaceVariableScalarReplacement *this_local;
  
  interface_vars.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)entry_point;
  CollectInterfaceVariables
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_38,this,entry_point);
  __range2._4_4_ = SuccessWithoutChange;
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_38);
  interface_var =
       (Instruction *)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                 ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)local_38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&interface_var);
    if (!bVar1) {
      this_local._4_4_ = __range2._4_4_;
LAB_00a01113:
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )local_38);
      return this_local._4_4_;
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    _component = *ppIVar3;
    bVar1 = GetVariableLocation(this,_component,(uint32_t *)((long)&interface_var_type + 4));
    if (bVar1) {
      bVar1 = GetVariableComponent(this,_component,(uint32_t *)&interface_var_type);
      if (!bVar1) {
        interface_var_type._0_4_ = 0;
      }
      pIStack_70 = GetTypeOfVariable(this,_component);
      local_74 = 0;
      bVar1 = HasExtraArrayness(this,(Instruction *)
                                     interface_vars.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,_component);
      if (bVar1) {
        pIVar4 = Pass::context(&this->super_Pass);
        pDVar5 = IRContext::get_def_use_mgr(pIVar4);
        local_74 = anon_unknown_0::GetArrayLength(pDVar5,pIStack_70);
        pIVar4 = Pass::context(&this->super_Pass);
        pDVar5 = IRContext::get_def_use_mgr(pIVar4);
        pIStack_70 = anon_unknown_0::GetArrayElementType(pDVar5,pIStack_70);
        std::
        unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        ::insert(&this->vars_with_extra_arrayness,(value_type *)&component);
      }
      else {
        std::
        unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        ::insert(&this->vars_without_extra_arrayness,(value_type *)&component);
      }
      bVar1 = CheckExtraArraynessConflictBetweenEntries(this,_component,local_74 != 0);
      if (!bVar1) {
        this_local._4_4_ = Failure;
        goto LAB_00a01113;
      }
      OVar2 = opt::Instruction::opcode(pIStack_70);
      if ((OVar2 == OpTypeArray) ||
         (OVar2 = opt::Instruction::opcode(pIStack_70), OVar2 == OpTypeMatrix)) {
        bVar1 = ReplaceInterfaceVariableWithScalars
                          (this,_component,pIStack_70,interface_var_type._4_4_,
                           (uint32_t)interface_var_type,local_74);
        if (!bVar1) {
          this_local._4_4_ = Failure;
          goto LAB_00a01113;
        }
        __range2._4_4_ = SuccessWithChange;
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Pass::Status
InterfaceVariableScalarReplacement::ReplaceInterfaceVarsWithScalars(
    Instruction& entry_point) {
  std::vector<Instruction*> interface_vars =
      CollectInterfaceVariables(entry_point);

  Pass::Status status = Status::SuccessWithoutChange;
  for (Instruction* interface_var : interface_vars) {
    uint32_t location, component;
    if (!GetVariableLocation(interface_var, &location)) continue;
    if (!GetVariableComponent(interface_var, &component)) component = 0;

    Instruction* interface_var_type = GetTypeOfVariable(interface_var);
    uint32_t extra_array_length = 0;
    if (HasExtraArrayness(entry_point, interface_var)) {
      extra_array_length =
          GetArrayLength(context()->get_def_use_mgr(), interface_var_type);
      interface_var_type =
          GetArrayElementType(context()->get_def_use_mgr(), interface_var_type);
      vars_with_extra_arrayness.insert(interface_var);
    } else {
      vars_without_extra_arrayness.insert(interface_var);
    }

    if (!CheckExtraArraynessConflictBetweenEntries(interface_var,
                                                   extra_array_length != 0)) {
      return Pass::Status::Failure;
    }

    if (interface_var_type->opcode() != spv::Op::OpTypeArray &&
        interface_var_type->opcode() != spv::Op::OpTypeMatrix) {
      continue;
    }

    if (!ReplaceInterfaceVariableWithScalars(interface_var, interface_var_type,
                                             location, component,
                                             extra_array_length)) {
      return Pass::Status::Failure;
    }
    status = Pass::Status::SuccessWithChange;
  }

  return status;
}